

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkDescriptorSetLayoutCreateInfo *layout,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  VkDescriptorSetLayoutBinding *pVVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  Value immutables;
  Value l;
  Value bindings;
  Value binding;
  Data local_b8;
  Data local_a8;
  Data local_98;
  Data local_88;
  Data *local_70;
  VkDescriptorSetLayoutCreateInfo *local_68;
  ulong local_60;
  Data local_58;
  StringRefType local_40;
  
  local_98.n.i64 = (Number)0x0;
  local_98.s.str = (Ch *)0x3000000000000;
  local_a8._4_1_ = '\0';
  local_a8._5_1_ = '\0';
  local_a8._6_1_ = '\0';
  local_a8._7_1_ = '\0';
  local_a8._0_4_ = layout->flags;
  local_b8.s.str = (Ch *)0x405000000155d97;
  local_b8.n = (Number)0x5;
  local_a8.s.str = (Ch *)((ulong)(-1 < (int)layout->flags) << 0x35 | 0x1d6000000000000);
  local_70 = &out_value->data_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a8.s,alloc);
  local_88.n = (Number)0x0;
  local_88.s.str = (Ch *)0x4000000000000;
  if (layout->bindingCount != 0) {
    uVar4 = 0;
    local_68 = layout;
    do {
      pVVar1 = local_68->pBindings;
      local_58.n.i64 = (Number)0x0;
      local_58.s.str = (Ch *)0x3000000000000;
      local_40.s = "descriptorType";
      local_40.length = 0xe;
      local_60 = uVar4;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkDescriptorType>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_58.s,&local_40,pVVar1[uVar4].descriptorType,alloc);
      local_a8._4_1_ = '\0';
      local_a8._5_1_ = '\0';
      local_a8._6_1_ = '\0';
      local_a8._7_1_ = '\0';
      local_a8._0_4_ = pVVar1[uVar4].descriptorCount;
      local_b8.s.str = (Ch *)0x405000000155d3e;
      local_b8.n = (Number)0xf;
      local_a8.s.str =
           (Ch *)((ulong)(-1 < (int)pVVar1[uVar4].descriptorCount) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_58.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_b8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_a8.s,alloc);
      local_a8._4_1_ = '\0';
      local_a8._5_1_ = '\0';
      local_a8._6_1_ = '\0';
      local_a8._7_1_ = '\0';
      local_a8._0_4_ = pVVar1[uVar4].stageFlags;
      local_b8.s.str = (Ch *)0x405000000155d5d;
      local_b8.n = (Number)0xa;
      local_a8.s.str =
           (Ch *)((ulong)(-1 < (int)pVVar1[uVar4].stageFlags) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_58.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_b8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_a8.s,alloc);
      local_a8._4_1_ = '\0';
      local_a8._5_1_ = '\0';
      local_a8._6_1_ = '\0';
      local_a8._7_1_ = '\0';
      local_a8._0_4_ = pVVar1[uVar4].binding;
      local_b8.s.str = (Ch *)0x405000000155d36;
      local_b8.n.i64 = (Number)0x7;
      local_a8.s.str = (Ch *)((ulong)(-1 < (int)pVVar1[uVar4].binding) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_58.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_b8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_a8.s,alloc);
      if (pVVar1[uVar4].pImmutableSamplers != (VkSampler *)0x0) {
        local_b8.n.i64 = (Number)0x0;
        local_b8.s.str = (Ch *)0x4000000000000;
        if (pVVar1[uVar4].descriptorCount != 0) {
          uVar5 = 0;
          do {
            uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Fossilize *)&local_a8.s,(uint64_t)pVVar1[uVar4].pImmutableSamplers[uVar5],
                       alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_b8.s,
                       (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_a8.s,alloc);
            uVar5 = uVar5 + 1;
          } while (uVar5 < pVVar1[uVar4].descriptorCount);
        }
        local_a8.s.str = (Ch *)0x405000000155d68;
        local_a8.n.i64 = (Number)0x11;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_58.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_a8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_b8.s,alloc);
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_88.s,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_58.s,alloc);
      uVar4 = local_60 + 1;
      layout = local_68;
    } while (uVar4 < local_68->bindingCount);
  }
  local_a8.s.str = (Ch *)0x405000000155e44;
  local_a8.n = (Number)0x8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,alloc);
  bVar2 = true;
  if (layout->pNext != (void *)0x0) {
    local_b8.n = (Number)0x0;
    local_b8.s.str = (Ch *)0x0;
    bVar3 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (layout->pNext,alloc,(Value *)&local_b8.s,(DynamicStateInfo *)0x0);
    if (bVar3) {
      local_a8.s.str = (Ch *)0x405000000155e4d;
      local_a8.n = (Number)0x5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_98.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_a8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_b8.s,alloc);
    }
    else {
      bVar2 = false;
    }
  }
  if ((bool)(&local_98 != local_70 & bVar2)) {
    local_70->n = local_98.n;
    (&local_70->n)[1] = (Number)local_98.s.str;
  }
  return bVar2;
}

Assistant:

static bool json_value(const VkDescriptorSetLayoutCreateInfo& layout, Allocator& alloc, Value *out_value)
{
	Value l(kObjectType);
	l.AddMember("flags", layout.flags, alloc);

	Value bindings(kArrayType);
	for (uint32_t i = 0; i < layout.bindingCount; i++)
	{
		auto &b = layout.pBindings[i];
		Value binding(kObjectType);
		binding.AddMember("descriptorType", b.descriptorType, alloc);
		binding.AddMember("descriptorCount", b.descriptorCount, alloc);
		binding.AddMember("stageFlags", b.stageFlags, alloc);
		binding.AddMember("binding", b.binding, alloc);
		if (b.pImmutableSamplers)
		{
			Value immutables(kArrayType);
			for (uint32_t j = 0; j < b.descriptorCount; j++)
				immutables.PushBack(uint64_string(api_object_cast<uint64_t>(b.pImmutableSamplers[j]), alloc), alloc);
			binding.AddMember("immutableSamplers", immutables, alloc);
		}
		bindings.PushBack(binding, alloc);
	}
	l.AddMember("bindings", bindings, alloc);

	if (!pnext_chain_add_json_value(l, layout, alloc, nullptr))
		return false;

	*out_value = l;
	return true;
}